

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O2

bool __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseUnsigned<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
          *ds,uint *u)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = ds->codepoint_;
  uVar2 = 0;
  if (0xfffffff5 < uVar1 - 0x3a) {
    while (uVar1 - 0x30 < 10) {
      if (0x35 < uVar1 && 0x19999998 < uVar2) {
        uVar2 = 0;
        goto LAB_00144cac;
      }
      uVar1 = DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>
              ::Take(ds);
      uVar2 = (uVar1 + uVar2 * 10) - 0x30;
      uVar1 = ds->codepoint_;
    }
    *u = uVar2;
    uVar2 = 1;
  }
LAB_00144cac:
  return SUB41(uVar2,0);
}

Assistant:

bool ParseUnsigned(DecodedStream<InputStream, Encoding>& ds, unsigned* u) {
        unsigned r = 0;
        if (ds.Peek() < '0' || ds.Peek() > '9')
            return false;
        while (ds.Peek() >= '0' && ds.Peek() <= '9') {
            if (r >= 429496729 && ds.Peek() > '5') // 2^32 - 1 = 4294967295
                return false; // overflow
            r = r * 10 + (ds.Take() - '0');
        }
        *u = r;
        return true;
    }